

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::prune(Dictionary *this,vector<int,_std::allocator<int>_> *idx)

{
  int *piVar1;
  pointer piVar2;
  pointer peVar3;
  entry_type eVar4;
  int32_t iVar5;
  const_iterator __cbeg;
  mapped_type *pmVar6;
  pointer peVar7;
  pointer *ppiVar8;
  ulong uVar9;
  long lVar10;
  int32_t j;
  int iVar11;
  int *piVar12;
  long lVar13;
  iterator __position;
  pointer piVar14;
  vector<int,std::allocator<int>> *pvVar15;
  iterator __begin2;
  ulong uVar16;
  int32_t x;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> ngrams;
  int local_84;
  vector<int,std::allocator<int>> *local_80;
  vector<int,_std::allocator<int>_> local_78;
  int *local_58;
  pointer piStack_50;
  int *local_48;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *local_38;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_48 = (int *)0x0;
  local_58 = (int *)0x0;
  piStack_50 = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_78,
             (long)(idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&local_58,
             (long)(idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  piVar12 = (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar1 = (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_80 = (vector<int,std::allocator<int>> *)idx;
  if (piVar12 != piVar1) {
    do {
      local_84 = *piVar12;
      if (local_84 < this->nwords_) {
        ppiVar8 = &local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        piVar14 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        __position._M_current =
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        pvVar15 = (vector<int,std::allocator<int>> *)&local_78;
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_0011e6ff;
LAB_0011e71d:
        *piVar14 = local_84;
        *ppiVar8 = piVar14 + 1;
      }
      else {
        ppiVar8 = &piStack_50;
        piVar14 = piStack_50;
        __position._M_current = piStack_50;
        pvVar15 = (vector<int,std::allocator<int>> *)&local_58;
        if (piStack_50 != local_48) goto LAB_0011e71d;
LAB_0011e6ff:
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar15,__position,&local_84);
      }
      piVar12 = piVar12 + 1;
    } while (piVar12 != piVar1);
  }
  piVar2 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar14 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  pvVar15 = local_80;
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar14,piVar2);
  }
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)pvVar15,&local_78);
  piVar14 = piStack_50;
  if (piStack_50 != local_58) {
    iVar11 = 0;
    piVar12 = local_58;
    do {
      local_84 = *piVar12 - this->nwords_;
      pmVar6 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->pruneidx_,&local_84);
      *pmVar6 = iVar11;
      iVar11 = iVar11 + 1;
      piVar12 = piVar12 + 1;
    } while (piVar12 != piVar14);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_80,*(undefined8 *)(local_80 + 8),local_58,piStack_50);
  }
  this->pruneidx_size_ = (this->pruneidx_)._M_h._M_element_count;
  piVar14 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar2 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar14 != piVar2) {
    memset(piVar14,0xff,((long)piVar2 + (-4 - (long)piVar14) & 0xfffffffffffffffcU) + 4);
  }
  local_38 = &this->words_;
  peVar7 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(this->words_).
                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)peVar7;
  if (lVar10 != 0) {
    uVar16 = 0;
    lVar13 = 0x30;
    iVar11 = 0;
    do {
      eVar4 = getType(this,(int32_t)uVar16);
      uVar9 = (ulong)iVar11;
      if ((eVar4 == label) ||
         ((uVar9 < (ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2) &&
          (uVar16 == (uint)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar9])))) {
        local_80 = (vector<int,std::allocator<int>> *)CONCAT44(local_80._4_4_,iVar11);
        peVar3 = (local_38->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        peVar7 = peVar3 + uVar9;
        std::__cxx11::string::_M_assign((string *)peVar7);
        peVar7->type = *(entry_type *)((long)peVar3 + lVar13 + -8);
        peVar7->count = *(int64_t *)((long)peVar3 + lVar13 + -0x10);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&peVar7->subwords,
                   (vector<int,_std::allocator<int>_> *)
                   ((long)&(peVar3->word)._M_dataplus._M_p + lVar13));
        iVar5 = find(this,&(this->words_).
                           super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar9].word);
        (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5] = (int)local_80;
        iVar11 = (int)local_80 + 1;
      }
      uVar16 = uVar16 + 1;
      peVar7 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(this->words_).
                     super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)peVar7;
      uVar9 = (lVar10 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + 0x48;
    } while (uVar16 <= uVar9 && uVar9 - uVar16 != 0);
  }
  iVar11 = (int)((ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  this->nwords_ = iVar11;
  lVar13 = (long)iVar11 + (long)this->nlabels_;
  this->size_ = (int32_t)lVar13;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase
            (local_38,peVar7 + lVar13,(entry *)((long)&(peVar7->word)._M_dataplus._M_p + lVar10));
  initNgrams(this);
  if (local_58 != (int *)0x0) {
    operator_delete(local_58);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Dictionary::prune(std::vector<int32_t>& idx) {
  std::vector<int32_t> words, ngrams;
  words.reserve(idx.size());
  ngrams.reserve(idx.size());
  for (int32_t x : idx) {
    if (x < nwords_) {
      words.push_back(x);
    } else {
      ngrams.push_back(x);
    }
  }
  std::sort(words.begin(), words.end());
  idx = words;

  if (ngrams.size() != 0) {
    int32_t j = 0;
    for (const auto ngram : ngrams) {
      pruneidx_[ngram - nwords_] = j;
      j++;
    }
    idx.insert(idx.end(), ngrams.begin(), ngrams.end());
  }
  pruneidx_size_ = pruneidx_.size();

  std::fill(word2int_.begin(), word2int_.end(), -1);

  int32_t j = 0;
  for (int32_t i = 0; i < words_.size(); i++) {
    if (getType(i) == entry_type::label ||
        (j < words.size() && words[j] == i)) {
      words_[j] = words_[i];
      word2int_[find(words_[j].word)] = j;
      j++;
    }
  }
  nwords_ = words.size();
  size_ = nwords_ + nlabels_;
  words_.erase(words_.begin() + size_, words_.end());
  initNgrams();
}